

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tests.cpp
# Opt level: O2

vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> * __thiscall
TestRunner::getTestsList
          (vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
           *__return_storage_ptr__,TestRunner *this,path *dir)

{
  size_type sVar1;
  bool bVar2;
  directory_entry *this_00;
  path *this_01;
  path *test;
  _Alloc_hider __args;
  directory_iterator dStack_118;
  TestRunner *local_108;
  directory_iterator __end1;
  directory_iterator __begin1;
  path local_e0;
  directory_iterator local_c0;
  path local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  path fileName;
  
  (__return_storage_ptr__->
  super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = this;
  ghc::filesystem::directory_iterator::directory_iterator(&dStack_118,dir);
  ghc::filesystem::directory_iterator::directory_iterator(&local_c0,&dStack_118);
  ghc::filesystem::begin(&local_c0);
  ghc::filesystem::directory_iterator::~directory_iterator(&local_c0);
  ghc::filesystem::end(&__end1);
  while( true ) {
    bVar2 = ghc::filesystem::directory_iterator::operator!=(&__begin1,&__end1);
    if (!bVar2) break;
    this_00 = ghc::filesystem::directory_iterator::operator*(&__begin1);
    bVar2 = ghc::filesystem::directory_entry::is_directory(this_00);
    if (bVar2) {
      this_01 = ghc::filesystem::directory_entry::path(this_00);
      ghc::filesystem::path::filename(&local_b0,this_01);
      ghc::filesystem::path::u8string_abi_cxx11_(&local_90,&local_b0);
      std::operator+(&local_70,&local_90,".asm");
      ghc::filesystem::path::path(&local_e0,&local_70,auto_format);
      ghc::filesystem::operator/(&fileName,this_01,&local_e0);
      ghc::filesystem::path::~path(&local_e0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      ghc::filesystem::path::~path(&local_b0);
      bVar2 = ghc::filesystem::exists(&fileName);
      if (bVar2) {
        std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::push_back
                  (__return_storage_ptr__,this_01);
      }
      else {
        getTestsList((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)
                     &local_e0,local_108,this_01);
        sVar1 = local_e0._path._M_string_length;
        for (__args._M_p = local_e0._path._M_dataplus._M_p; __args._M_p != (pointer)sVar1;
            __args._M_p = __args._M_p + 0x20) {
          std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::
          emplace_back<ghc::filesystem::path>(__return_storage_ptr__,(path *)__args._M_p);
        }
        std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::~vector
                  ((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)
                   &local_e0);
      }
      ghc::filesystem::path::~path(&fileName);
    }
    ghc::filesystem::directory_iterator::operator++(&__begin1);
  }
  ghc::filesystem::directory_iterator::~directory_iterator(&__end1);
  ghc::filesystem::directory_iterator::~directory_iterator(&__begin1);
  ghc::filesystem::directory_iterator::~directory_iterator(&dStack_118);
  return __return_storage_ptr__;
}

Assistant:

std::vector<fs::path> TestRunner::getTestsList(const fs::path& dir)
{
	std::vector<fs::path> tests;

	for(auto &entry : fs::directory_iterator(dir))
	{
		if (!entry.is_directory())
			continue;

		const auto &path = entry.path();
		fs::path fileName = path / (path.filename().u8string() + ".asm");

		if (fs::exists(fileName))
		{
			tests.push_back(path);
		}
		else
		{
			for (auto &&test : getTestsList(path))
			{
				tests.emplace_back(std::move(test));
			}
		}
	}

	return tests;
}